

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O3

int __thiscall crnlib::dxt_image::init(dxt_image *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  uint min_new_capacity;
  element *__s;
  bool bVar2;
  undefined7 extraout_var;
  uint in_ECX;
  uint in_EDX;
  char in_R8B;
  
  bVar2 = init_internal(this,(dxt_format)ctx,in_EDX,in_ECX);
  if (bVar2) {
    uVar1 = (this->m_elements).m_size;
    min_new_capacity = this->m_total_elements;
    if (uVar1 != min_new_capacity) {
      if ((uVar1 <= min_new_capacity) && ((this->m_elements).m_capacity < min_new_capacity)) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this,min_new_capacity,uVar1 + 1 == min_new_capacity,8,
                   (object_mover)0x0,false);
      }
      (this->m_elements).m_size = min_new_capacity;
    }
    __s = (this->m_elements).m_p;
    this->m_pElements = __s;
    if (in_R8B != '\0') {
      memset(__s,0,(ulong)this->m_total_elements << 3);
    }
  }
  return (int)CONCAT71(extraout_var,bVar2);
}

Assistant:

bool dxt_image::init(dxt_format fmt, uint width, uint height, bool clear_elements) {
  if (!init_internal(fmt, width, height))
    return false;

  m_elements.resize(m_total_elements);
  m_pElements = &m_elements[0];

  if (clear_elements)
    memset(m_pElements, 0, sizeof(element) * m_total_elements);

  return true;
}